

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O0

void point_add_mixed(pt_prj_t_conflict3 *R,pt_prj_t_conflict3 *Q,pt_aff_t_conflict3 *P)

{
  long in_RDX;
  limb_t nz;
  fe_t_conflict2 Z3;
  fe_t_conflict2 Y3;
  fe_t_conflict2 X3;
  limb_t *Y2;
  limb_t *X2;
  limb_t *Z1;
  limb_t *Y1;
  limb_t *X1;
  limb_t *b;
  fe_t_conflict2 t4;
  fe_t_conflict2 t3;
  fe_t_conflict2 t2;
  fe_t_conflict2 t1;
  fe_t_conflict2 t0;
  uint64_t *in_stack_000010a0;
  uint64_t *in_stack_000010a8;
  uint64_t *in_stack_000010b0;
  uint64_t local_250 [7];
  uint64_t *in_stack_fffffffffffffde8;
  uint64_t *in_stack_fffffffffffffdf0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 in_stack_fffffffffffffdff;
  uint64_t *in_stack_fffffffffffffe00;
  uint64_t *in_stack_fffffffffffffeb0;
  uint64_t *in_stack_fffffffffffffeb8;
  uint64_t *in_stack_fffffffffffffec0;
  uint64_t *in_stack_fffffffffffffef0;
  uint64_t *in_stack_fffffffffffffef8;
  uint64_t *in_stack_ffffffffffffff00;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetB_nonzero(local_250,(uint64_t *)(in_RDX + 0x40));
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  return;
}

Assistant:

static void point_add_mixed(pt_prj_t *R, const pt_prj_t *Q, const pt_aff_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3, t4;
    /* constants */
    const limb_t *b = const_b;
    /* set pointers for legacy curve arith */
    const limb_t *X1 = Q->X;
    const limb_t *Y1 = Q->Y;
    const limb_t *Z1 = Q->Z;
    const limb_t *X2 = P->X;
    const limb_t *Y2 = P->Y;
    fe_t X3;
    fe_t Y3;
    fe_t Z3;
    limb_t nz;

    /* check P for affine inf */
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_nonzero(&nz, P->Y);

    /* the curve arith formula */
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t0, X1, X2);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t1, Y1, Y2);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t3, X2, Y2);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t4, X1, Y1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t3, t3, t4);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t4, t0, t1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_sub(t3, t3, t4);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t4, Y2, Z1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t4, t4, Y1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(Y3, X2, Z1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(Y3, Y3, X1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(Z3, b, Z1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_sub(X3, Y3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(Z3, X3, X3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(X3, X3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_sub(Z3, t1, X3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(X3, t1, X3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(Y3, b, Y3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t1, Z1, Z1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t2, t1, Z1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_sub(Y3, Y3, t2);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_sub(Y3, Y3, t0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t1, Y3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(Y3, t1, Y3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t1, t0, t0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(t0, t1, t0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_sub(t0, t0, t2);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t1, t4, Y3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t2, t0, Y3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(Y3, X3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(Y3, Y3, t2);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(X3, t3, X3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_sub(X3, X3, t1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(Z3, t4, Z3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t1, t3, t0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(Z3, Z3, t1);

    /* if P is inf, throw all that away and take Q */
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_selectznz(R->X, nz, Q->X, X3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_selectznz(R->Y, nz, Q->Y, Y3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_selectznz(R->Z, nz, Q->Z, Z3);
}